

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderBody
          (PythonGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr,
          size_t index,bool in_array)

{
  FieldDef *field;
  StructDef *pSVar1;
  char *pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  undefined7 in_register_00000089;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  BaseType BVar10;
  ulong uVar11;
  ulong uVar12;
  pointer ppFVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  string indent;
  string local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  undefined8 uStack_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  uint local_b4;
  PythonGenerator *local_b0;
  StructDef *local_a8;
  size_t local_a0;
  IdlNamer *local_98;
  char *local_90;
  pointer local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  size_t local_40;
  StructDef *local_38;
  
  local_b4 = (uint)CONCAT71(in_register_00000089,in_array);
  local_80 = local_70;
  local_b0 = this;
  local_a8 = struct_def;
  local_a0 = index;
  local_90 = nameprefix;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)index * '\x04');
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_80,local_78 + (long)local_80)
  ;
  std::__cxx11::string::append((char *)&local_118);
  NumToString<unsigned_long>(&local_f8,local_a8->minalign);
  uVar11 = 0xf;
  if (local_118 != &local_108) {
    uVar11 = local_108;
  }
  if (uVar11 < local_f8._M_string_length + local_110) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar5 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_110 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
      goto LAB_00289544;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
LAB_00289544:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138.field_2._8_8_ = puVar3[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_138._M_string_length = puVar3[1];
  *puVar3 = psVar7;
  puVar3[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_c8 = *plVar6;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar6;
    local_d8 = (long *)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  NumToString<unsigned_long>(&local_138,local_a8->bytesize);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_c8 = *plVar6;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar6;
    local_d8 = (long *)*plVar4;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  ppFVar13 = (local_a8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar13 !=
      (local_a8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_98 = &local_b0->namer_;
    local_40 = local_a0 + 1;
    do {
      paVar9 = &local_138.field_2;
      field = ppFVar13[-1];
      BVar10 = (field->value).type.base_type;
      if (BVar10 == BASE_TYPE_ARRAY) {
        BVar10 = (field->value).type.element;
      }
      local_38 = (field->value).type.struct_def;
      local_88 = ppFVar13;
      if (field->padding != 0) {
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_80,local_78 + (long)local_80);
        std::__cxx11::string::append((char *)&local_118);
        NumToString<unsigned_long>(&local_f8,field->padding);
        uVar11 = 0xf;
        if (local_118 != &local_108) {
          uVar11 = local_108;
        }
        if (uVar11 < local_f8._M_string_length + local_110) {
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar5 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < local_f8._M_string_length + local_110) goto LAB_00289811;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
        }
        else {
LAB_00289811:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
        }
        psVar7 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138.field_2._8_8_ = puVar3[3];
          local_138._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_138._M_string_length = puVar3[1];
        *puVar3 = psVar7;
        puVar3[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_d8 = &local_c8;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar4[3];
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar4;
        }
        local_d0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar9) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
      }
      if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((field->value).type.struct_def)->fixed == true)) {
        pSVar1 = (field->value).type.struct_def;
        (*(local_98->super_Namer)._vptr_Namer[0x12])(&local_118,local_98,field);
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
        pcVar2 = local_90;
        psVar7 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138.field_2._8_8_ = puVar3[3];
          local_138._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_138._M_string_length = puVar3[1];
        *puVar3 = psVar7;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        strlen(local_90);
        plVar4 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_138,0,(char *)0x0,(ulong)pcVar2);
        local_d8 = &local_c8;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar4[3];
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar4;
        }
        local_d0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        StructBuilderBody(local_b0,pSVar1,(char *)local_d8,code_ptr,local_a0,
                          (bool)((byte)local_b4 & 1));
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar9) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        ppFVar13 = local_88;
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
          ppFVar13 = local_88;
        }
      }
      else {
        NumToString<unsigned_long>(&local_138,local_a0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x376a54);
        local_d8 = &local_c8;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_c8 = *plVar6;
          lStack_c0 = plVar4[3];
        }
        else {
          local_c8 = *plVar6;
          local_d8 = (long *)*plVar4;
        }
        local_d0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar9) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_80,local_78 + (long)local_80);
          std::__cxx11::string::append((char *)&local_f8);
          puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
          local_118 = &local_108;
          puVar8 = puVar3 + 2;
          if ((ulong *)*puVar3 == puVar8) {
            local_108 = *puVar8;
            uStack_100 = puVar3[3];
          }
          else {
            local_108 = *puVar8;
            local_118 = (ulong *)*puVar3;
          }
          local_110 = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          psVar7 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138.field_2._8_8_ = puVar3[3];
            local_138._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_138._M_string_length = puVar3[1];
          *puVar3 = psVar7;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar9) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          NumToString<unsigned_short>(&local_138,(field->value).type.fixed_length);
          uVar5 = std::__cxx11::string::_M_append
                            ((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar9) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
            uVar5 = extraout_RAX;
          }
          local_b4 = (uint)CONCAT71((int7)((ulong)uVar5 >> 8),1);
          std::__cxx11::string::append((char *)code_ptr);
        }
        if ((BVar10 == BASE_TYPE_STRUCT) && (local_38->fixed == true)) {
          pSVar1 = (field->value).type.struct_def;
          (*(local_98->super_Namer)._vptr_Namer[0x12])(&local_f8,local_98,field);
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
          pcVar2 = local_90;
          local_118 = &local_108;
          puVar8 = puVar3 + 2;
          if ((ulong *)*puVar3 == puVar8) {
            local_108 = *puVar8;
            uStack_100 = puVar3[3];
          }
          else {
            local_108 = *puVar8;
            local_118 = (ulong *)*puVar3;
          }
          local_110 = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          strlen(local_90);
          plVar4 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_118,0,(char *)0x0,(ulong)pcVar2);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138.field_2._8_8_ = plVar4[3];
            local_138._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_138._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          StructBuilderBody(local_b0,pSVar1,local_138._M_dataplus._M_p,code_ptr,local_40,
                            (bool)((byte)local_b4 & 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar9) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          ppFVar13 = local_88;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)code_ptr);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_80,local_78 + (long)local_80);
          std::__cxx11::string::append((char *)&local_f8);
          GenMethod_abi_cxx11_(&local_60,local_b0,field);
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar5 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < local_60._M_string_length + local_f8._M_string_length) {
            uVar5 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              uVar5 = local_60.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < local_60._M_string_length + local_f8._M_string_length)
            goto LAB_00289d14;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_60,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
LAB_00289d14:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_60._M_dataplus._M_p);
          }
          puVar8 = puVar3 + 2;
          if ((ulong *)*puVar3 == puVar8) {
            local_108 = *puVar8;
            uStack_100 = puVar3[3];
            local_118 = &local_108;
          }
          else {
            local_108 = *puVar8;
            local_118 = (ulong *)*puVar3;
          }
          local_110 = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)puVar8 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138.field_2._8_8_ = plVar4[3];
            local_138._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_138._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar9) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          (*(local_98->super_Namer)._vptr_Namer[7])(&local_118,local_98,field);
          pcVar2 = local_90;
          strlen(local_90);
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)pcVar2);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar7 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138.field_2._8_8_ = puVar3[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar7;
            local_138._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_138._M_string_length = puVar3[1];
          *puVar3 = psVar7;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          paVar9 = &local_138.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar9) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if (((local_b4 & 1) != 0) &&
             (uVar11 = ((field->value).type.base_type == BASE_TYPE_ARRAY) + local_a0, uVar11 != 0))
          {
            uVar12 = 1;
            do {
              NumToString<unsigned_long>(&local_f8,uVar12 - 1);
              puVar3 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x376a53);
              local_118 = &local_108;
              puVar8 = puVar3 + 2;
              if ((ulong *)*puVar3 == puVar8) {
                local_108 = *puVar8;
                uStack_100 = puVar3[3];
              }
              else {
                local_108 = *puVar8;
                local_118 = (ulong *)*puVar3;
              }
              local_110 = puVar3[1];
              *puVar3 = puVar8;
              puVar3[1] = 0;
              *(undefined1 *)(puVar3 + 2) = 0;
              puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
              psVar7 = puVar3 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar3 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_138.field_2._M_allocated_capacity = *psVar7;
                local_138.field_2._8_8_ = puVar3[3];
                local_138._M_dataplus._M_p = (pointer)paVar9;
              }
              else {
                local_138.field_2._M_allocated_capacity = *psVar7;
                local_138._M_dataplus._M_p = (pointer)*puVar3;
              }
              local_138._M_string_length = puVar3[1];
              *puVar3 = psVar7;
              puVar3[1] = 0;
              *(undefined1 *)(puVar3 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar9) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
            } while (((local_b4 & 1) != 0) &&
                    (bVar14 = uVar12 < uVar11, uVar12 = uVar12 + 1, bVar14));
          }
          std::__cxx11::string::append((char *)code_ptr);
          ppFVar13 = local_88;
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
      }
      ppFVar13 = ppFVar13 + -1;
    } while (ppFVar13 !=
             (local_a8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr, size_t index = 0,
                         bool in_array = false) const {
    auto &code = *code_ptr;
    std::string indent(index * 4, ' ');
    code +=
        indent + "    builder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (field.padding)
        code +=
            indent + "    builder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field_type)) {
        StructBuilderBody(*field_type.struct_def,
                          (nameprefix + (namer_.Field(field) + "_")).c_str(),
                          code_ptr, index, in_array);
      } else {
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "    for " + index_var + " in range(";
          code += NumToString(field_type.fixed_length);
          code += " , 0, -1):\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          StructBuilderBody(*field_type.struct_def,
                            (nameprefix + (namer_.Field(field) + "_")).c_str(),
                            code_ptr, index + 1, in_array);
        } else {
          code += IsArray(field_type) ? "    " : "";
          code += indent + "    builder.Prepend" + GenMethod(field) + "(";
          code += nameprefix + namer_.Variable(field);
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          for (size_t i = 0; in_array && i < array_cnt; i++) {
            code += "[_idx" + NumToString(i) + "-1]";
          }
          code += ")\n";
        }
      }
    }
  }